

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O0

void ggml_backend_load_all_from_path(char *dir_path)

{
  char *pcVar1;
  char *backend_path;
  bool silent;
  char *in_stack_00000030;
  char *in_stack_00000488;
  bool in_stack_00000497;
  char *in_stack_00000498;
  
  ggml_backend_load_best(in_stack_00000498,in_stack_00000497,in_stack_00000488);
  ggml_backend_load_best(in_stack_00000498,in_stack_00000497,in_stack_00000488);
  ggml_backend_load_best(in_stack_00000498,in_stack_00000497,in_stack_00000488);
  ggml_backend_load_best(in_stack_00000498,in_stack_00000497,in_stack_00000488);
  ggml_backend_load_best(in_stack_00000498,in_stack_00000497,in_stack_00000488);
  ggml_backend_load_best(in_stack_00000498,in_stack_00000497,in_stack_00000488);
  ggml_backend_load_best(in_stack_00000498,in_stack_00000497,in_stack_00000488);
  ggml_backend_load_best(in_stack_00000498,in_stack_00000497,in_stack_00000488);
  ggml_backend_load_best(in_stack_00000498,in_stack_00000497,in_stack_00000488);
  ggml_backend_load_best(in_stack_00000498,in_stack_00000497,in_stack_00000488);
  ggml_backend_load_best(in_stack_00000498,in_stack_00000497,in_stack_00000488);
  ggml_backend_load_best(in_stack_00000498,in_stack_00000497,in_stack_00000488);
  pcVar1 = getenv("GGML_BACKEND_PATH");
  if (pcVar1 != (char *)0x0) {
    ggml_backend_load(in_stack_00000030);
  }
  return;
}

Assistant:

void ggml_backend_load_all_from_path(const char * dir_path) {
#ifdef NDEBUG
    bool silent = true;
#else
    bool silent = false;
#endif

    ggml_backend_load_best("blas", silent, dir_path);
    ggml_backend_load_best("cann", silent, dir_path);
    ggml_backend_load_best("cuda", silent, dir_path);
    ggml_backend_load_best("hip", silent, dir_path);
    ggml_backend_load_best("kompute", silent, dir_path);
    ggml_backend_load_best("metal", silent, dir_path);
    ggml_backend_load_best("rpc", silent, dir_path);
    ggml_backend_load_best("sycl", silent, dir_path);
    ggml_backend_load_best("vulkan", silent, dir_path);
    ggml_backend_load_best("opencl", silent, dir_path);
    ggml_backend_load_best("musa", silent, dir_path);
    ggml_backend_load_best("cpu", silent, dir_path);
    // check the environment variable GGML_BACKEND_PATH to load an out-of-tree backend
    const char * backend_path = std::getenv("GGML_BACKEND_PATH");
    if (backend_path) {
        ggml_backend_load(backend_path);
    }
}